

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadMaterialLibrary(CoronaLoader *this,FileName *fileName)

{
  bool bVar1;
  runtime_error *this_00;
  CoronaLoader *pCVar2;
  FileName *in_RSI;
  Node *in_RDI;
  Ref<embree::XML> *child;
  iterator __end1;
  iterator __begin1;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *__range1;
  Ref<embree::XML> xml;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
  *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  Node *pNVar3;
  undefined1 hasHeader;
  string *id;
  FileName *in_stack_fffffffffffffed8;
  __normal_iterator<embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
  local_118;
  long *local_110;
  undefined1 local_101;
  ParseLocation *in_stack_ffffffffffffff08;
  string local_e0 [55];
  undefined1 local_a9 [65];
  long *local_68;
  Node *xml_00;
  CoronaLoader *in_stack_ffffffffffffffb8;
  Ref<embree::XML> *in_stack_ffffffffffffffc0;
  CoronaLoader *in_stack_ffffffffffffffc8;
  
  pNVar3 = in_RDI;
  xml_00 = in_RDI;
  embree::FileName::operator+(in_RSI,(FileName *)in_RDI);
  hasHeader = (undefined1)((ulong)in_RSI >> 0x38);
  id = (string *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a9 + 1),"/.-",(allocator *)id);
  parseXML(in_stack_fffffffffffffed8,id,(bool)hasHeader);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  embree::FileName::~FileName((FileName *)0x410823);
  bVar1 = std::operator!=(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
  if (bVar1) {
    local_101 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff08);
    std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
    std::runtime_error::runtime_error(this_00,local_e0);
    local_101 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_110 = local_68 + 0x10;
  local_118._M_current =
       (Ref<embree::XML> *)
       std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::begin
                 (in_stack_fffffffffffffe58);
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::end
            (in_stack_fffffffffffffe58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                             *)in_stack_fffffffffffffe60,
                            (__normal_iterator<embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                             *)in_stack_fffffffffffffe58), bVar1) {
    pCVar2 = (CoronaLoader *)
             __gnu_cxx::
             __normal_iterator<embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
             ::operator*(&local_118);
    bVar1 = std::operator==(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
    if (bVar1) {
      loadMaterialDefinition(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      pCVar2 = in_stack_ffffffffffffffc8;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
      if (bVar1) {
        loadMapDefinition(in_stack_ffffffffffffffb8,(Ref<embree::XML> *)xml_00);
      }
    }
    __gnu_cxx::
    __normal_iterator<embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
    ::operator++(&local_118);
    in_stack_ffffffffffffffc8 = pCVar2;
  }
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)pNVar3;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadMaterialLibrary(const FileName& fileName) 
  {
    Ref<XML> xml = parseXML(path+fileName,"/.-",false);
    if (xml->name != "mtlLib") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material library");
    
    for (auto& child : xml->children)
    {
      if (child->name == "materialDefinition") {
        loadMaterialDefinition(child);
      }
      else if (child->name == "mapDefinition")
        loadMapDefinition(child);
    }

    return nullptr;
  }